

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaNormalTargetGenerator.cxx
# Opt level: O0

void __thiscall
cmNinjaNormalTargetGenerator::WriteNvidiaDeviceLinkStatement
          (cmNinjaNormalTargetGenerator *this,string *config,string *fileConfig,string *outputDir,
          string *output)

{
  cmLocalCommonGenerator *pcVar1;
  pointer *ppbVar2;
  undefined8 uVar3;
  bool bVar4;
  __type _Var5;
  byte bVar6;
  uint uVar7;
  TargetType TVar8;
  cmGeneratorTarget *pcVar9;
  string *psVar10;
  char *pcVar11;
  mapped_type *pmVar12;
  cmLocalNinjaGenerator *pcVar13;
  mapped_type *linkFlags;
  cmMakefile *this_00;
  ulong uVar14;
  cmGeneratorTarget *pcVar15;
  size_t sVar16;
  cmGeneratedFileStream *os;
  cmOutputConverter *local_cd8;
  __type local_c59;
  bool local_c33;
  byte local_c32;
  allocator<char> local_c31;
  undefined1 local_c30 [5];
  bool usedResponseFile;
  cmAlphaNum local_c00;
  string local_bd0;
  cmAlphaNum local_bb0;
  cmAlphaNum local_b80;
  string local_b50;
  int local_b30;
  char local_b2a [2];
  int commandLineLengthLimit;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_b20;
  char local_b12 [2];
  char *local_b10;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_b08;
  allocator<char> local_af9;
  key_type local_af8;
  mapped_type *local_ad8;
  string *link_path;
  key_type local_ac8;
  mapped_type *local_aa8;
  string *linkLibraries;
  key_type local_a98;
  string_view local_a78;
  string local_a68;
  string local_a48;
  cmAlphaNum local_a28;
  string local_9f8;
  cmAlphaNum local_9d8;
  undefined1 local_9a8 [8];
  string objPath;
  key_type local_980;
  string_view local_960;
  undefined1 local_950 [8];
  string impLibPath;
  key_type local_928;
  string_view local_908;
  string local_8f8;
  undefined1 local_8d8 [8];
  string install_dir;
  key_type local_8b0;
  string_view local_890;
  string local_880;
  allocator<char> local_859;
  key_type local_858;
  string local_838;
  undefined1 local_818 [8];
  Names tgtNames;
  key_type local_750;
  allocator<char> local_729;
  string local_728;
  undefined1 local_708 [8];
  string langFlags;
  key_type local_6e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6c0;
  allocator<char> local_699;
  key_type local_698;
  string local_678;
  allocator<char> local_651;
  key_type local_650;
  allocator<char> local_629;
  key_type local_628;
  string local_608;
  allocator<char> local_5e1;
  string local_5e0;
  allocator<char> local_5b9;
  key_type local_5b8;
  allocator<char> local_591;
  key_type local_590;
  cmStateSnapshot local_570;
  cmStateDirectory local_558;
  undefined1 local_530 [8];
  cmNinjaLinkLineDeviceComputer linkLineComputer;
  key_type local_4e0;
  string_view local_4c0;
  string local_4b0;
  cmLocalNinjaGenerator *local_490;
  cmLocalNinjaGenerator *localGen;
  undefined1 local_468 [8];
  string createRule;
  string linkPath;
  string frameworkPath;
  cmNinjaDeps local_3e8;
  cmNinjaDeps local_3d0;
  pointer *local_3b8;
  cmNinjaVars *vars;
  cmAlphaNum local_3a8;
  cmAlphaNum local_378;
  string local_348;
  string local_328;
  undefined1 local_308 [8];
  cmNinjaBuild build;
  string local_1e0;
  byte local_1b9;
  string local_1b8;
  string local_198;
  int local_174;
  string local_170 [32];
  string local_150;
  cmAlphaNum local_130;
  string local_100;
  cmAlphaNum local_e0;
  undefined1 local_b0 [8];
  string targetOutputFileConfigDir;
  string local_80;
  undefined1 local_60 [8];
  string targetOutputImplib;
  cmGlobalNinjaGenerator *globalGen;
  cmGeneratorTarget *genTarget;
  string *output_local;
  string *outputDir_local;
  string *fileConfig_local;
  string *config_local;
  cmNinjaNormalTargetGenerator *this_local;
  
  pcVar9 = cmNinjaTargetGenerator::GetGeneratorTarget(&this->super_cmNinjaTargetGenerator);
  targetOutputImplib.field_2._8_8_ =
       cmNinjaTargetGenerator::GetGlobalGenerator(&this->super_cmNinjaTargetGenerator);
  cmGeneratorTarget::GetFullPath(&local_80,pcVar9,config,ImportLibraryArtifact,false);
  psVar10 = cmNinjaTargetGenerator::ConvertToNinjaPath
                      (&this->super_cmNinjaTargetGenerator,&local_80);
  std::__cxx11::string::string((string *)local_60,(string *)psVar10);
  std::__cxx11::string::~string((string *)&local_80);
  bVar4 = std::operator!=(config,fileConfig);
  if (bVar4) {
    pcVar13 = cmNinjaTargetGenerator::GetLocalGenerator(&this->super_cmNinjaTargetGenerator);
    (*(pcVar13->super_cmLocalCommonGenerator).super_cmLocalGenerator._vptr_cmLocalGenerator[0xe])
              (&local_100,pcVar13,pcVar9);
    cmAlphaNum::cmAlphaNum(&local_e0,&local_100);
    (**(code **)(*(long *)targetOutputImplib.field_2._8_8_ + 0x248))
              (&local_150,targetOutputImplib.field_2._8_8_,fileConfig);
    cmAlphaNum::cmAlphaNum(&local_130,&local_150);
    cmStrCat<char[2]>((string *)local_b0,&local_e0,&local_130,(char (*) [2])0xc78192);
    std::__cxx11::string::~string((string *)&local_150);
    std::__cxx11::string::~string((string *)&local_100);
    (**(code **)(*(long *)targetOutputImplib.field_2._8_8_ + 0xb0))
              (local_170,targetOutputImplib.field_2._8_8_,outputDir,fileConfig);
    std::__cxx11::string::operator=((string *)local_b0,local_170);
    std::__cxx11::string::~string(local_170);
    _Var5 = std::operator==(outputDir,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_b0);
    if (_Var5) {
      local_174 = 1;
    }
    else {
      local_1b9 = 0;
      build.RspFile.field_2._M_local_buf[0xf] = '\0';
      cmGeneratorTarget::GetFullName(&local_198,pcVar9,config,ImportLibraryArtifact);
      uVar7 = std::__cxx11::string::empty();
      local_c59 = false;
      if ((uVar7 & 1) == 0) {
        cmGeneratorTarget::GetFullName(&local_1b8,pcVar9,fileConfig,ImportLibraryArtifact);
        local_1b9 = 1;
        uVar7 = std::__cxx11::string::empty();
        local_c59 = false;
        if ((uVar7 & 1) == 0) {
          cmGeneratorTarget::GetFullPath(&local_1e0,pcVar9,fileConfig,ImportLibraryArtifact,false);
          build.RspFile.field_2._M_local_buf[0xf] = '\x01';
          psVar10 = cmNinjaTargetGenerator::ConvertToNinjaPath
                              (&this->super_cmNinjaTargetGenerator,&local_1e0);
          local_c59 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_60,psVar10);
        }
      }
      if ((build.RspFile.field_2._M_local_buf[0xf] & 1U) != 0) {
        std::__cxx11::string::~string((string *)&local_1e0);
      }
      if ((local_1b9 & 1) != 0) {
        std::__cxx11::string::~string((string *)&local_1b8);
      }
      std::__cxx11::string::~string((string *)&local_198);
      if (local_c59 == false) {
        local_174 = 0;
      }
      else {
        local_174 = 1;
      }
    }
    std::__cxx11::string::~string((string *)local_b0);
    if (local_174 != 0) goto LAB_00520928;
  }
  LanguageLinkerDeviceRule(&local_328,this,config);
  cmNinjaBuild::cmNinjaBuild((cmNinjaBuild *)local_308,&local_328);
  std::__cxx11::string::~string((string *)&local_328);
  cmAlphaNum::cmAlphaNum(&local_378,"Link the ");
  pcVar11 = GetVisibleTypeName(this);
  cmAlphaNum::cmAlphaNum(&local_3a8,pcVar11);
  vars._7_1_ = 0x20;
  cmStrCat<char,std::__cxx11::string>
            (&local_348,&local_378,&local_3a8,(char *)((long)&vars + 7),output);
  std::__cxx11::string::operator=((string *)local_308,(string *)&local_348);
  std::__cxx11::string::~string((string *)&local_348);
  local_3b8 = &build.OrderOnlyDeps.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&build.Rule.field_2 + 8),output);
  cmNinjaTargetGenerator::GetObjects(&local_3d0,&this->super_cmNinjaTargetGenerator,config);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&build.WorkDirOuts.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_3d0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_3d0);
  TargetLinkLanguage((string *)((long)&frameworkPath.field_2 + 8),this,config);
  cmNinjaTargetGenerator::ComputeLinkDeps
            (&local_3e8,&this->super_cmNinjaTargetGenerator,
             (string *)((long)&frameworkPath.field_2 + 8),config,false);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&build.ExplicitDeps.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_3e8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_3e8);
  std::__cxx11::string::~string((string *)(frameworkPath.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(linkPath.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(createRule.field_2._M_local_buf + 8));
  TargetLinkLanguage((string *)&localGen,this,config);
  cmGeneratorTarget::GetCreateRuleVariable((string *)local_468,pcVar9,(string *)&localGen,config);
  std::__cxx11::string::~string((string *)&localGen);
  local_490 = cmNinjaTargetGenerator::GetLocalGenerator(&this->super_cmNinjaTargetGenerator);
  pcVar1 = &local_490->super_cmLocalCommonGenerator;
  local_4c0 = (string_view)
              std::__cxx11::string::operator_cast_to_basic_string_view((string *)output);
  cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
            (&local_4b0,&(pcVar1->super_cmLocalGenerator).super_cmOutputConverter,local_4c0,SHELL);
  ppbVar2 = local_3b8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4e0,"TARGET_FILE",(allocator<char> *)((long)&linkLineComputer.GG + 7))
  ;
  pmVar12 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)ppbVar2,&local_4e0);
  std::__cxx11::string::operator=((string *)pmVar12,(string *)&local_4b0);
  std::__cxx11::string::~string((string *)&local_4e0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&linkLineComputer.GG + 7));
  std::__cxx11::string::~string((string *)&local_4b0);
  pcVar13 = cmNinjaTargetGenerator::GetLocalGenerator(&this->super_cmNinjaTargetGenerator);
  local_cd8 = (cmOutputConverter *)0x0;
  if (pcVar13 != (cmLocalNinjaGenerator *)0x0) {
    local_cd8 = &(pcVar13->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                 super_cmOutputConverter;
  }
  pcVar13 = cmNinjaTargetGenerator::GetLocalGenerator(&this->super_cmNinjaTargetGenerator);
  cmLocalGenerator::GetStateSnapshot(&local_570,(cmLocalGenerator *)pcVar13);
  cmStateSnapshot::GetDirectory(&local_558,&local_570);
  cmNinjaLinkLineDeviceComputer::cmNinjaLinkLineDeviceComputer
            ((cmNinjaLinkLineDeviceComputer *)local_530,local_cd8,&local_558,
             (cmGlobalNinjaGenerator *)targetOutputImplib.field_2._8_8_);
  bVar6 = (**(code **)(*(long *)targetOutputImplib.field_2._8_8_ + 0x130))();
  cmLinkLineComputer::SetUseNinjaMulti((cmLinkLineComputer *)local_530,(bool)(bVar6 & 1));
  ppbVar2 = local_3b8;
  pcVar13 = local_490;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_590,"LINK_LIBRARIES",&local_591);
  pmVar12 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)ppbVar2,&local_590);
  ppbVar2 = local_3b8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_5b8,"LINK_FLAGS",&local_5b9);
  linkFlags = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)ppbVar2,&local_5b8);
  cmLocalGenerator::GetDeviceLinkFlags
            ((cmLocalGenerator *)pcVar13,(cmLinkLineDeviceComputer *)local_530,config,pmVar12,
             linkFlags,(string *)((long)&linkPath.field_2 + 8),
             (string *)((long)&createRule.field_2 + 8),pcVar9);
  std::__cxx11::string::~string((string *)&local_5b8);
  std::allocator<char>::~allocator(&local_5b9);
  std::__cxx11::string::~string((string *)&local_590);
  std::allocator<char>::~allocator(&local_591);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_5e0,"JOB_POOL_LINK",&local_5e1);
  cmNinjaTargetGenerator::addPoolNinjaVariable
            (&this->super_cmNinjaTargetGenerator,&local_5e0,pcVar9,(cmNinjaVars *)local_3b8);
  std::__cxx11::string::~string((string *)&local_5e0);
  std::allocator<char>::~allocator(&local_5e1);
  uVar3 = targetOutputImplib.field_2._8_8_;
  ppbVar2 = local_3b8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_628,"LINK_FLAGS",&local_629);
  pmVar12 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)ppbVar2,&local_628);
  cmGlobalNinjaGenerator::EncodeLiteral(&local_608,(cmGlobalNinjaGenerator *)uVar3,pmVar12);
  ppbVar2 = local_3b8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_650,"LINK_FLAGS",&local_651);
  pmVar12 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)ppbVar2,&local_650);
  std::__cxx11::string::operator=((string *)pmVar12,(string *)&local_608);
  std::__cxx11::string::~string((string *)&local_650);
  std::allocator<char>::~allocator(&local_651);
  std::__cxx11::string::~string((string *)&local_608);
  std::__cxx11::string::~string((string *)&local_628);
  std::allocator<char>::~allocator(&local_629);
  cmCommonTargetGenerator::GetManifests(&local_678,(cmCommonTargetGenerator *)this,config);
  ppbVar2 = local_3b8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_698,"MANIFESTS",&local_699);
  pmVar12 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)ppbVar2,&local_698);
  std::__cxx11::string::operator=((string *)pmVar12,(string *)&local_678);
  std::__cxx11::string::~string((string *)&local_698);
  std::allocator<char>::~allocator(&local_699);
  std::__cxx11::string::~string((string *)&local_678);
  std::operator+(&local_6c0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&linkPath.field_2 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&createRule.field_2 + 8));
  ppbVar2 = local_3b8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_6e0,"LINK_PATH",
             (allocator<char> *)(langFlags.field_2._M_local_buf + 0xf));
  pmVar12 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)ppbVar2,&local_6e0);
  std::__cxx11::string::operator=((string *)pmVar12,(string *)&local_6c0);
  std::__cxx11::string::~string((string *)&local_6e0);
  std::allocator<char>::~allocator((allocator<char> *)(langFlags.field_2._M_local_buf + 0xf));
  std::__cxx11::string::~string((string *)&local_6c0);
  std::__cxx11::string::string((string *)local_708);
  pcVar13 = local_490;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_728,"CUDA",&local_729);
  cmLocalGenerator::AddLanguageFlagsForLinking
            ((cmLocalGenerator *)pcVar13,(string *)local_708,pcVar9,&local_728,config);
  std::__cxx11::string::~string((string *)&local_728);
  std::allocator<char>::~allocator(&local_729);
  ppbVar2 = local_3b8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_750,"LANGUAGE_COMPILE_FLAGS",
             (allocator<char> *)(tgtNames.SharedObject.field_2._M_local_buf + 0xf));
  pmVar12 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)ppbVar2,&local_750);
  std::__cxx11::string::operator=((string *)pmVar12,(string *)local_708);
  std::__cxx11::string::~string((string *)&local_750);
  std::allocator<char>::~allocator
            ((allocator<char> *)(tgtNames.SharedObject.field_2._M_local_buf + 0xf));
  TargetNames((Names *)local_818,this,config);
  bVar4 = cmGeneratorTarget::HasSOName(pcVar9,config);
  if (bVar4) {
    this_00 = cmNinjaTargetGenerator::GetMakefile(&this->super_cmNinjaTargetGenerator);
    TargetLinkLanguage(&local_838,this,config);
    pcVar11 = cmMakefile::GetSONameFlag(this_00,&local_838);
    ppbVar2 = local_3b8;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_858,"SONAME_FLAG",&local_859);
    pmVar12 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)ppbVar2,&local_858);
    std::__cxx11::string::operator=((string *)pmVar12,pcVar11);
    std::__cxx11::string::~string((string *)&local_858);
    std::allocator<char>::~allocator(&local_859);
    std::__cxx11::string::~string((string *)&local_838);
    pcVar1 = &local_490->super_cmLocalCommonGenerator;
    local_890 = (string_view)
                std::__cxx11::string::operator_cast_to_basic_string_view
                          ((string *)(tgtNames.PDB.field_2._M_local_buf + 8));
    cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
              (&local_880,&(pcVar1->super_cmLocalGenerator).super_cmOutputConverter,local_890,SHELL)
    ;
    ppbVar2 = local_3b8;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_8b0,"SONAME",
               (allocator<char> *)(install_dir.field_2._M_local_buf + 0xf));
    pmVar12 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)ppbVar2,&local_8b0);
    std::__cxx11::string::operator=((string *)pmVar12,(string *)&local_880);
    std::__cxx11::string::~string((string *)&local_8b0);
    std::allocator<char>::~allocator((allocator<char> *)(install_dir.field_2._M_local_buf + 0xf));
    std::__cxx11::string::~string((string *)&local_880);
    TVar8 = cmGeneratorTarget::GetType(pcVar9);
    if (TVar8 == SHARED_LIBRARY) {
      pcVar15 = cmNinjaTargetGenerator::GetGeneratorTarget(&this->super_cmNinjaTargetGenerator);
      cmGeneratorTarget::GetInstallNameDirForBuildTree((string *)local_8d8,pcVar15,config);
      uVar14 = std::__cxx11::string::empty();
      if ((uVar14 & 1) == 0) {
        pcVar1 = &local_490->super_cmLocalCommonGenerator;
        local_908 = (string_view)
                    std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_8d8);
        cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
                  (&local_8f8,&(pcVar1->super_cmLocalGenerator).super_cmOutputConverter,local_908,
                   SHELL);
        ppbVar2 = local_3b8;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_928,"INSTALLNAME_DIR",
                   (allocator<char> *)(impLibPath.field_2._M_local_buf + 0xf));
        pmVar12 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)ppbVar2,&local_928);
        std::__cxx11::string::operator=((string *)pmVar12,(string *)&local_8f8);
        std::__cxx11::string::~string((string *)&local_928);
        std::allocator<char>::~allocator((allocator<char> *)(impLibPath.field_2._M_local_buf + 0xf))
        ;
        std::__cxx11::string::~string((string *)&local_8f8);
      }
      std::__cxx11::string::~string((string *)local_8d8);
    }
  }
  uVar14 = std::__cxx11::string::empty();
  if ((uVar14 & 1) == 0) {
    pcVar1 = &local_490->super_cmLocalCommonGenerator;
    local_960 = (string_view)
                std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_60);
    cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
              ((string *)local_950,&(pcVar1->super_cmLocalGenerator).super_cmOutputConverter,
               local_960,SHELL);
    ppbVar2 = local_3b8;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_980,"TARGET_IMPLIB",
               (allocator<char> *)(objPath.field_2._M_local_buf + 0xf));
    pmVar12 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)ppbVar2,&local_980);
    std::__cxx11::string::operator=((string *)pmVar12,(string *)local_950);
    std::__cxx11::string::~string((string *)&local_980);
    std::allocator<char>::~allocator((allocator<char> *)(objPath.field_2._M_local_buf + 0xf));
    cmNinjaTargetGenerator::EnsureParentDirectoryExists
              (&this->super_cmNinjaTargetGenerator,(string *)local_60);
    std::__cxx11::string::~string((string *)local_950);
  }
  pcVar15 = cmNinjaTargetGenerator::GetGeneratorTarget(&this->super_cmNinjaTargetGenerator);
  cmGeneratorTarget::GetSupportDirectory_abi_cxx11_(&local_9f8,pcVar15);
  cmAlphaNum::cmAlphaNum(&local_9d8,&local_9f8);
  (**(code **)(*(long *)targetOutputImplib.field_2._8_8_ + 0x248))
            (&local_a48,targetOutputImplib.field_2._8_8_,config);
  cmAlphaNum::cmAlphaNum(&local_a28,&local_a48);
  cmStrCat<>((string *)local_9a8,&local_9d8,&local_a28);
  std::__cxx11::string::~string((string *)&local_a48);
  std::__cxx11::string::~string((string *)&local_9f8);
  pcVar13 = cmNinjaTargetGenerator::GetLocalGenerator(&this->super_cmNinjaTargetGenerator);
  psVar10 = cmNinjaTargetGenerator::ConvertToNinjaPath
                      (&this->super_cmNinjaTargetGenerator,(string *)local_9a8);
  local_a78 = (string_view)
              std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar10);
  cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
            (&local_a68,
             &(pcVar13->super_cmLocalCommonGenerator).super_cmLocalGenerator.super_cmOutputConverter
             ,local_a78,SHELL);
  ppbVar2 = local_3b8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a98,"OBJECT_DIR",(allocator<char> *)((long)&linkLibraries + 7));
  pmVar12 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)ppbVar2,&local_a98);
  std::__cxx11::string::operator=((string *)pmVar12,(string *)&local_a68);
  std::__cxx11::string::~string((string *)&local_a98);
  std::allocator<char>::~allocator((allocator<char> *)((long)&linkLibraries + 7));
  std::__cxx11::string::~string((string *)&local_a68);
  cmNinjaTargetGenerator::EnsureDirectoryExists
            (&this->super_cmNinjaTargetGenerator,(string *)local_9a8);
  cmNinjaTargetGenerator::SetMsvcTargetPdbVariable
            (&this->super_cmNinjaTargetGenerator,(cmNinjaVars *)local_3b8,config);
  ppbVar2 = local_3b8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_ac8,"LINK_LIBRARIES",(allocator<char> *)((long)&link_path + 7));
  pmVar12 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)ppbVar2,&local_ac8);
  std::__cxx11::string::~string((string *)&local_ac8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&link_path + 7));
  ppbVar2 = local_3b8;
  local_aa8 = pmVar12;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_af8,"LINK_PATH",&local_af9);
  pmVar12 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)ppbVar2,&local_af8);
  std::__cxx11::string::~string((string *)&local_af8);
  std::allocator<char>::~allocator(&local_af9);
  local_ad8 = pmVar12;
  bVar4 = cmGlobalNinjaGenerator::IsGCCOnWindows
                    ((cmGlobalNinjaGenerator *)targetOutputImplib.field_2._8_8_);
  if (bVar4) {
    local_b08._M_current = (char *)std::__cxx11::string::begin();
    local_b10 = (char *)std::__cxx11::string::end();
    local_b12[1] = 0x5c;
    local_b12[0] = '/';
    std::replace<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char>
              (local_b08,
               (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                )local_b10,local_b12 + 1,local_b12);
    local_b20._M_current = (char *)std::__cxx11::string::begin();
    _commandLineLengthLimit = (char *)std::__cxx11::string::end();
    local_b2a[1] = 0x5c;
    local_b2a[0] = '/';
    std::replace<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char>
              (local_b20,_commandLineLengthLimit,local_b2a + 1,local_b2a);
  }
  sVar16 = cmSystemTools::CalculateCommandLineLengthLimit();
  local_b30 = cmGlobalNinjaGenerator::GetRuleCmdLength
                        ((cmGlobalNinjaGenerator *)targetOutputImplib.field_2._8_8_,
                         (string *)((long)&build.Comment.field_2 + 8));
  local_b30 = (int)sVar16 - local_b30;
  cmAlphaNum::cmAlphaNum(&local_b80,"CMakeFiles/");
  psVar10 = cmGeneratorTarget::GetName_abi_cxx11_(pcVar9);
  cmAlphaNum::cmAlphaNum(&local_bb0,psVar10);
  local_c32 = 0;
  bVar6 = (**(code **)(*(long *)targetOutputImplib.field_2._8_8_ + 0x130))();
  if ((bVar6 & 1) == 0) {
    std::allocator<char>::allocator();
    local_c32 = 1;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_bd0,"",&local_c31);
  }
  else {
    cmAlphaNum::cmAlphaNum(&local_c00,'.');
    cmAlphaNum::cmAlphaNum((cmAlphaNum *)local_c30,config);
    cmStrCat<>(&local_bd0,&local_c00,(cmAlphaNum *)local_c30);
  }
  cmStrCat<std::__cxx11::string,char[5]>
            (&local_b50,&local_b80,&local_bb0,&local_bd0,(char (*) [5])0xc53d31);
  psVar10 = cmNinjaTargetGenerator::ConvertToNinjaPath
                      (&this->super_cmNinjaTargetGenerator,&local_b50);
  std::__cxx11::string::operator=
            ((string *)&build.Variables._M_t._M_impl.super__Rb_tree_header._M_node_count,
             (string *)psVar10);
  std::__cxx11::string::~string((string *)&local_b50);
  std::__cxx11::string::~string((string *)&local_bd0);
  if ((local_c32 & 1) != 0) {
    std::allocator<char>::~allocator(&local_c31);
  }
  pcVar13 = cmNinjaTargetGenerator::GetLocalGenerator(&this->super_cmNinjaTargetGenerator);
  pcVar9 = cmNinjaTargetGenerator::GetGeneratorTarget(&this->super_cmNinjaTargetGenerator);
  cmLocalNinjaGenerator::AppendTargetDepends
            (pcVar13,pcVar9,
             (cmNinjaDeps *)
             &build.ImplicitDeps.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,config,config,
             DependOnTargetArtifact);
  uVar3 = targetOutputImplib.field_2._8_8_;
  local_c33 = false;
  os = cmNinjaTargetGenerator::GetCommonFileStream(&this->super_cmNinjaTargetGenerator);
  cmGlobalNinjaGenerator::WriteBuild
            ((cmGlobalNinjaGenerator *)uVar3,(ostream *)os,(cmNinjaBuild *)local_308,local_b30,
             &local_c33);
  WriteNvidiaDeviceLinkRule(this,(bool)(local_c33 & 1),config);
  std::__cxx11::string::~string((string *)local_9a8);
  cmGeneratorTarget::Names::~Names((Names *)local_818);
  std::__cxx11::string::~string((string *)local_708);
  cmNinjaLinkLineDeviceComputer::~cmNinjaLinkLineDeviceComputer
            ((cmNinjaLinkLineDeviceComputer *)local_530);
  std::__cxx11::string::~string((string *)local_468);
  std::__cxx11::string::~string((string *)(createRule.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(linkPath.field_2._M_local_buf + 8));
  cmNinjaBuild::~cmNinjaBuild((cmNinjaBuild *)local_308);
  local_174 = 0;
LAB_00520928:
  std::__cxx11::string::~string((string *)local_60);
  return;
}

Assistant:

void cmNinjaNormalTargetGenerator::WriteNvidiaDeviceLinkStatement(
  const std::string& config, const std::string& fileConfig,
  const std::string& outputDir, const std::string& output)
{
  cmGeneratorTarget* genTarget = this->GetGeneratorTarget();
  cmGlobalNinjaGenerator* globalGen = this->GetGlobalGenerator();

  std::string targetOutputImplib = this->ConvertToNinjaPath(
    genTarget->GetFullPath(config, cmStateEnums::ImportLibraryArtifact));

  if (config != fileConfig) {
    std::string targetOutputFileConfigDir =
      cmStrCat(this->GetLocalGenerator()->GetTargetDirectory(genTarget),
               globalGen->ConfigDirectory(fileConfig), "/");
    targetOutputFileConfigDir =
      globalGen->ExpandCFGIntDir(outputDir, fileConfig);
    if (outputDir == targetOutputFileConfigDir) {
      return;
    }

    if (!genTarget->GetFullName(config, cmStateEnums::ImportLibraryArtifact)
           .empty() &&
        !genTarget
           ->GetFullName(fileConfig, cmStateEnums::ImportLibraryArtifact)
           .empty() &&
        targetOutputImplib ==
          this->ConvertToNinjaPath(genTarget->GetFullPath(
            fileConfig, cmStateEnums::ImportLibraryArtifact))) {
      return;
    }
  }

  // Compute the comment.
  cmNinjaBuild build(this->LanguageLinkerDeviceRule(config));
  build.Comment =
    cmStrCat("Link the ", this->GetVisibleTypeName(), ' ', output);

  cmNinjaVars& vars = build.Variables;

  // Compute outputs.
  build.Outputs.push_back(output);
  // Compute specific libraries to link with.
  build.ExplicitDeps = this->GetObjects(config);
  build.ImplicitDeps =
    this->ComputeLinkDeps(this->TargetLinkLanguage(config), config);

  std::string frameworkPath;
  std::string linkPath;

  std::string createRule =
    genTarget->GetCreateRuleVariable(this->TargetLinkLanguage(config), config);
  cmLocalNinjaGenerator& localGen = *this->GetLocalGenerator();

  vars["TARGET_FILE"] =
    localGen.ConvertToOutputFormat(output, cmOutputConverter::SHELL);

  cmNinjaLinkLineDeviceComputer linkLineComputer(
    this->GetLocalGenerator(),
    this->GetLocalGenerator()->GetStateSnapshot().GetDirectory(), globalGen);
  linkLineComputer.SetUseNinjaMulti(globalGen->IsMultiConfig());

  localGen.GetDeviceLinkFlags(linkLineComputer, config, vars["LINK_LIBRARIES"],
                              vars["LINK_FLAGS"], frameworkPath, linkPath,
                              genTarget);

  this->addPoolNinjaVariable("JOB_POOL_LINK", genTarget, vars);

  vars["LINK_FLAGS"] = globalGen->EncodeLiteral(vars["LINK_FLAGS"]);

  vars["MANIFESTS"] = this->GetManifests(config);

  vars["LINK_PATH"] = frameworkPath + linkPath;

  // Compute language specific link flags.
  std::string langFlags;
  localGen.AddLanguageFlagsForLinking(langFlags, genTarget, "CUDA", config);
  vars["LANGUAGE_COMPILE_FLAGS"] = langFlags;

  auto const tgtNames = this->TargetNames(config);
  if (genTarget->HasSOName(config)) {
    vars["SONAME_FLAG"] =
      this->GetMakefile()->GetSONameFlag(this->TargetLinkLanguage(config));
    vars["SONAME"] = localGen.ConvertToOutputFormat(tgtNames.SharedObject,
                                                    cmOutputConverter::SHELL);
    if (genTarget->GetType() == cmStateEnums::SHARED_LIBRARY) {
      std::string install_dir =
        this->GetGeneratorTarget()->GetInstallNameDirForBuildTree(config);
      if (!install_dir.empty()) {
        vars["INSTALLNAME_DIR"] = localGen.ConvertToOutputFormat(
          install_dir, cmOutputConverter::SHELL);
      }
    }
  }

  if (!tgtNames.ImportLibrary.empty()) {
    const std::string impLibPath = localGen.ConvertToOutputFormat(
      targetOutputImplib, cmOutputConverter::SHELL);
    vars["TARGET_IMPLIB"] = impLibPath;
    this->EnsureParentDirectoryExists(targetOutputImplib);
  }

  const std::string objPath =
    cmStrCat(this->GetGeneratorTarget()->GetSupportDirectory(),
             globalGen->ConfigDirectory(config));

  vars["OBJECT_DIR"] = this->GetLocalGenerator()->ConvertToOutputFormat(
    this->ConvertToNinjaPath(objPath), cmOutputConverter::SHELL);
  this->EnsureDirectoryExists(objPath);

  this->SetMsvcTargetPdbVariable(vars, config);

  std::string& linkLibraries = vars["LINK_LIBRARIES"];
  std::string& link_path = vars["LINK_PATH"];
  if (globalGen->IsGCCOnWindows()) {
    // ar.exe can't handle backslashes in rsp files (implicitly used by gcc)
    std::replace(linkLibraries.begin(), linkLibraries.end(), '\\', '/');
    std::replace(link_path.begin(), link_path.end(), '\\', '/');
  }

  // Device linking currently doesn't support response files so
  // do not check if the user has explicitly forced a response file.
  int const commandLineLengthLimit =
    static_cast<int>(cmSystemTools::CalculateCommandLineLengthLimit()) -
    globalGen->GetRuleCmdLength(build.Rule);

  build.RspFile = this->ConvertToNinjaPath(
    cmStrCat("CMakeFiles/", genTarget->GetName(),
             globalGen->IsMultiConfig() ? cmStrCat('.', config) : "", ".rsp"));

  // Gather order-only dependencies.
  this->GetLocalGenerator()->AppendTargetDepends(
    this->GetGeneratorTarget(), build.OrderOnlyDeps, config, config,
    DependOnTargetArtifact);

  // Write the build statement for this target.
  bool usedResponseFile = false;
  globalGen->WriteBuild(this->GetCommonFileStream(), build,
                        commandLineLengthLimit, &usedResponseFile);
  this->WriteNvidiaDeviceLinkRule(usedResponseFile, config);
}